

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void Catch::defaultListListeners
               (ostream *out,
               vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               *descriptions)

{
  pointer pLVar1;
  size_type sVar2;
  char *pcVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pLVar6;
  long *plVar7;
  ulong *puVar8;
  pointer pLVar9;
  char local_119;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  undefined8 local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  long *local_f8;
  ulong local_f0;
  long local_e8 [2];
  Column local_d8;
  size_t local_98;
  size_t local_90;
  Column local_88;
  Columns local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Registered listeners:\n",0x16);
  pLVar9 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pLVar6 = pLVar9;
  pLVar5 = pLVar9;
  if (pLVar9 != pLVar1) {
    while (pLVar4 = pLVar6, pLVar5 = pLVar5 + 1, pLVar5 != pLVar1) {
      pLVar6 = pLVar5;
      if ((pLVar5->name).m_size <= (pLVar4->name).m_size) {
        pLVar6 = pLVar4;
      }
    }
    sVar2 = (pLVar4->name).m_size;
    local_98 = 0x48 - sVar2;
    local_90 = sVar2 + 5;
    do {
      pcVar3 = (pLVar9->name).m_start;
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,pcVar3,pcVar3 + (pLVar9->name).m_size);
      plVar7 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_f8,local_f0,0,'\x01');
      puVar8 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_108._M_allocated_capacity = *puVar8;
        local_108._8_8_ = plVar7[3];
        local_118 = &local_108;
      }
      else {
        local_108._M_allocated_capacity = *puVar8;
        local_118 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7;
      }
      local_d8.m_string.m_string._M_dataplus._M_p = (pointer)&local_d8.m_string.m_string.field_2;
      local_d8.m_string.m_string._M_string_length = plVar7[1];
      *plVar7 = (long)puVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_118 == &local_108) {
        local_d8.m_string.m_string.field_2._8_8_ = local_108._8_8_;
      }
      else {
        local_d8.m_string.m_string._M_dataplus._M_p = (pointer)local_118;
      }
      local_d8.m_string.m_string.field_2._M_allocated_capacity = local_108._M_allocated_capacity;
      local_110 = 0;
      local_108._M_allocated_capacity = local_108._M_allocated_capacity & 0xffffffffffffff00;
      local_d8.m_string.m_size = 0;
      local_118 = &local_108;
      TextFlow::AnsiSkippingString::preprocessString(&local_d8.m_string);
      local_d8.m_initialIndent = 0xffffffffffffffff;
      local_d8.m_indent = 2;
      local_d8.m_width = local_90;
      TextFlow::Column::Column(&local_88,&pLVar9->description);
      local_88.m_initialIndent = 0;
      local_88.m_indent = 2;
      local_88.m_width = local_98;
      TextFlow::operator+(&local_48,&local_d8,&local_88);
      TextFlow::operator<<(out,&local_48);
      local_119 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_119,1);
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                (&local_48.m_columns);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.m_string.m_string._M_dataplus._M_p != &local_88.m_string.m_string.field_2) {
        operator_delete(local_88.m_string.m_string._M_dataplus._M_p,
                        local_88.m_string.m_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.m_string.m_string._M_dataplus._M_p != &local_d8.m_string.m_string.field_2) {
        operator_delete(local_d8.m_string.m_string._M_dataplus._M_p,
                        local_d8.m_string.m_string.field_2._M_allocated_capacity + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108._M_allocated_capacity + 1);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] + 1);
      }
      pLVar9 = pLVar9 + 1;
    } while (pLVar9 != pLVar1);
    local_d8.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_d8,1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void defaultListListeners( std::ostream& out,
                               std::vector<ListenerDescription> const& descriptions ) {
        out << "Registered listeners:\n";

        if(descriptions.empty()) {
            return;
        }

        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ListenerDescription const& lhs,
                                  ListenerDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            out << TextFlow::Column( static_cast<std::string>( desc.name ) +
                                     ':' )
                           .indent( 2 )
                           .width( maxNameLen + 5 ) +
                       TextFlow::Column( desc.description )
                           .initialIndent( 0 )
                           .indent( 2 )
                           .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                << '\n';
        }

        out << '\n' << std::flush;
    }